

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::
Data<QHashPrivate::Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>_>::
rehash(Data<QHashPrivate::Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>_>
       *this,size_t sizeHint)

{
  uchar *puVar1;
  byte bVar2;
  ulong uVar3;
  Span *pSVar4;
  Entry *pEVar5;
  undefined8 uVar6;
  quintptr qVar7;
  QAbstractItemModel *pQVar8;
  Mapping *pMVar9;
  Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*> *pNVar10;
  ulong uVar11;
  size_t index;
  long lVar12;
  Span *pSVar13;
  size_t numBuckets;
  long lVar14;
  R_conflict7 RVar15;
  Bucket BVar16;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  numBuckets = 0x80;
  if ((0x40 < sizeHint) && (numBuckets = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar12 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar12 ^ 0x3f) & 0x3f);
  }
  uVar3 = this->numBuckets;
  pSVar4 = this->spans;
  RVar15 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar15.spans;
  this->numBuckets = numBuckets;
  if (0x7f < uVar3) {
    uVar11 = 0;
    pSVar13 = pSVar4;
    do {
      lVar12 = 0;
      do {
        bVar2 = pSVar13->offsets[lVar12];
        if (bVar2 != 0xff) {
          pEVar5 = pSVar4[uVar11].entries;
          BVar16 = findBucket<QtPrivate::QModelIndexWrapper>
                             (this,(QModelIndexWrapper *)(pEVar5 + bVar2));
          pNVar10 = Span<QHashPrivate::Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>_>
                    ::insert(BVar16.span,BVar16.index);
          uVar6 = *(undefined8 *)pEVar5[bVar2].storage.data;
          qVar7 = *(quintptr *)(pEVar5[bVar2].storage.data + 8);
          puVar1 = pEVar5[bVar2].storage.data + 0x10;
          pQVar8 = *(QAbstractItemModel **)puVar1;
          pMVar9 = *(Mapping **)(puVar1 + 8);
          (pNVar10->key).index.r = (int)uVar6;
          (pNVar10->key).index.c = (int)((ulong)uVar6 >> 0x20);
          (pNVar10->key).index.i = qVar7;
          (pNVar10->key).index.m.ptr = pQVar8;
          pNVar10->value = pMVar9;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x80);
      if (pSVar4[uVar11].entries != (Entry *)0x0) {
        operator_delete__(pSVar4[uVar11].entries);
        pSVar4[uVar11].entries = (Entry *)0x0;
      }
      uVar11 = uVar11 + 1;
      pSVar13 = pSVar13 + 1;
    } while (uVar11 != uVar3 >> 7);
  }
  if (pSVar4 != (Span *)0x0) {
    lVar12 = *(long *)&pSVar4[-1].allocated;
    if (lVar12 != 0) {
      lVar14 = lVar12 * 0x90;
      do {
        if (*(void **)(pSVar4->offsets + lVar14 + -0x10) != (void *)0x0) {
          operator_delete__(*(void **)(pSVar4->offsets + lVar14 + -0x10));
          puVar1 = pSVar4->offsets + lVar14 + -0x10;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
        }
        lVar14 = lVar14 + -0x90;
      } while (lVar14 != 0);
    }
    operator_delete__(&pSVar4[-1].allocated,lVar12 * 0x90 + 8);
    return;
  }
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }